

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O1

void write_marker_header(j_compress_ptr cinfo,int marker,uint datalen)

{
  jpeg_error_mgr *pjVar1;
  
  if (0xfffd < datalen) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0xc;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  emit_byte(cinfo,0xff);
  emit_byte(cinfo,marker);
  emit_byte(cinfo,datalen + 2 >> 8 & 0xff);
  emit_byte(cinfo,datalen + 2 & 0xff);
  return;
}

Assistant:

METHODDEF(void)
write_marker_header (j_compress_ptr cinfo, int marker, unsigned int datalen)
/* Emit an arbitrary marker header */
{
  if (datalen > (unsigned int) 65533)		/* safety check */
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  emit_marker(cinfo, (JPEG_MARKER) marker);

  emit_2bytes(cinfo, (int) (datalen + 2));	/* total length */
}